

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

void apply_closure(fsg_model_t *fsg,bitvec_t *active)

{
  hash_table_t *h;
  long lVar1;
  int iVar2;
  fsg_link_t *link;
  hash_iter_t *itor;
  hash_table_t *null_trans;
  int state;
  bitvec_t *active_local;
  fsg_model_t *fsg_local;
  
  for (null_trans._4_4_ = 0; (int)null_trans._4_4_ < fsg->n_state;
      null_trans._4_4_ = null_trans._4_4_ + 1) {
    if ((((ulong)active[(int)null_trans._4_4_ / 0x20] & 1L << ((byte)null_trans._4_4_ & 0x1f)) != 0)
       && (h = fsg->trans[(int)null_trans._4_4_].null_trans, h != (hash_table_t *)0x0)) {
      for (link = (fsg_link_t *)hash_table_iter(h); link != (fsg_link_t *)0x0;
          link = (fsg_link_t *)hash_table_iter_next((hash_iter_t *)link)) {
        lVar1 = *(long *)(*(long *)&link->logs2prob + 0x10);
        iVar2 = *(int *)(lVar1 + 4) / 0x20;
        active[iVar2] = active[iVar2] | (uint)(1L << ((byte)*(undefined4 *)(lVar1 + 4) & 0x1f));
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x3b4,"epsilon %d -> %d\n",(ulong)null_trans._4_4_,(ulong)*(uint *)(lVar1 + 4));
      }
    }
  }
  return;
}

Assistant:

static void
apply_closure(fsg_model_t *fsg, bitvec_t *active)
{
    int state;

    /* This is a bit slow, sorry. */
    for (state = 0; state < fsg_model_n_state(fsg); ++state) {
        hash_table_t *null_trans;
        hash_iter_t *itor;

        if (!bitvec_is_set(active, state))
            continue;
        null_trans = fsg->trans[state].null_trans;
        if (null_trans == NULL)
            continue;
        /* We assume closure has already been done, so no need to
         * continue following epsilons. */
        for (itor = hash_table_iter(null_trans);
             itor != NULL; itor = hash_table_iter_next(itor)) {
            fsg_link_t *link = (fsg_link_t *)hash_entry_val(itor->ent);
            bitvec_set(active, link->to_state);
            E_INFO("epsilon %d -> %d\n", state, link->to_state);
        }
    }
}